

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

string * __thiscall Node::to_string_abi_cxx11_(string *__return_storage_ptr__,Node *this)

{
  initializer_list<char> __l;
  bool bVar1;
  reference pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_d9;
  _Self local_d8;
  _Base_ptr local_d0;
  _Rb_tree_const_iterator<char> local_c8;
  _Self local_c0;
  char local_b1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_b0;
  char c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  int i;
  allocator_type local_81;
  less<char> local_80;
  char local_7f [7];
  iterator local_78;
  size_type local_70;
  undefined1 local_68 [8];
  set<char,_std::less<char>,_std::allocator<char>_> escapeChars;
  string newLabel;
  Node *this_local;
  string *str;
  
  std::__cxx11::string::string
            ((string *)&escapeChars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  builtin_strncpy(local_7f,"{}\";()\n",7);
  local_78 = local_7f;
  local_70 = 7;
  std::allocator<char>::allocator();
  __l._M_len = local_70;
  __l._M_array = local_78;
  std::set<char,_std::less<char>,_std::allocator<char>_>::set
            ((set<char,_std::less<char>,_std::allocator<char>_> *)local_68,__l,&local_80,&local_81);
  std::allocator<char>::~allocator(&local_81);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_b0._M_current = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff50), bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    local_b1 = *pcVar2;
    if (local_b1 != '\n') {
      if (local_b1 == '#') {
        local_b1 = '_';
      }
      local_c8._M_node =
           (_Base_ptr)
           std::set<char,_std::less<char>,_std::allocator<char>_>::begin
                     ((set<char,_std::less<char>,_std::allocator<char>_> *)local_68);
      local_d0 = (_Base_ptr)
                 std::set<char,_std::less<char>,_std::allocator<char>_>::end
                           ((set<char,_std::less<char>,_std::allocator<char>_> *)local_68);
      local_c0._M_node =
           (_Base_ptr)
           std::find<std::_Rb_tree_const_iterator<char>,char>
                     (local_c8,(_Rb_tree_const_iterator<char>)local_d0,&local_b1);
      local_d8._M_node =
           (_Base_ptr)
           std::set<char,_std::less<char>,_std::allocator<char>_>::end
                     ((set<char,_std::less<char>,_std::allocator<char>_> *)local_68);
      bVar1 = std::operator!=(&local_c0,&local_d8);
      if (bVar1) {
        std::__cxx11::string::operator+=
                  ((string *)&escapeChars._M_t._M_impl.super__Rb_tree_header._M_node_count,'\\');
      }
      std::__cxx11::string::operator+=
                ((string *)&escapeChars._M_t._M_impl.super__Rb_tree_header._M_node_count,local_b1);
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  local_d9 = 0;
  std::operator+(&local_1a0,&this->name,"[label=\"");
  std::operator+(&local_180,&local_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &escapeChars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::operator+(&local_160,&local_180,"\" shape=");
  std::operator+(&local_140,&local_160,&this->shape);
  std::operator+(&local_120,&local_140," ");
  std::operator+(&local_100,&local_120,&this->extra);
  std::operator+(__return_storage_ptr__,&local_100,"]");
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  local_d9 = 1;
  std::set<char,_std::less<char>,_std::allocator<char>_>::~set
            ((set<char,_std::less<char>,_std::allocator<char>_> *)local_68);
  std::__cxx11::string::~string
            ((string *)&escapeChars._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return __return_storage_ptr__;
}

Assistant:

string Node::to_string() {
    std::string newLabel;
    std::set<char> escapeChars = {'{', '}', '"', ';', '(', ')', '\n'};
    int i = 0;
    for (char c: label) {
        i++;
        if (c == '\n')
            continue;
        if (c == '#')
            c = '_';
        if (std::find(escapeChars.begin(), escapeChars.end(), c) != escapeChars.end()) {
            newLabel += '\\';
        }
        newLabel += c;
    }
    string str = name + "[label=\"" + newLabel + "\" shape=" + shape + " " + extra + "]";
    return str;
}